

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

workspace_list * workspace_list_create(size_t count)

{
  workspace_list *__ptr;
  map *map;
  workspace **ppwVar1;
  
  __ptr = (workspace_list *)malloc(0x28);
  if (__ptr != (workspace_list *)0x0) {
    __ptr->count = count;
    __ptr->theme = (theme *)0x0;
    map = map_init();
    __ptr->client_map = map;
    if (map != (map *)0x0) {
      map_set_key_compare_function(map,compare_windows);
      map_set_key_size_function(map,get_client_list_key_size);
      ppwVar1 = (workspace **)calloc(count,8);
      __ptr->workspaces = ppwVar1;
      if (ppwVar1 != (workspace **)0x0) {
        return __ptr;
      }
      map_destroy(map);
    }
    free(__ptr);
  }
  return (workspace_list *)0x0;
}

Assistant:

struct workspace_list *workspace_list_create(size_t count)
{
        struct workspace_list *workspace_list = malloc(sizeof(struct workspace_list));

        if (workspace_list == NULL) {
                return NULL;
        }

        workspace_list->count = count;
        workspace_list->theme = NULL;
        workspace_list->client_map = map_init();

        if (workspace_list->client_map == NULL) {
                free(workspace_list);

                return NULL;
        }

        map_set_key_compare_function(workspace_list->client_map, compare_windows);
        map_set_key_size_function(workspace_list->client_map, get_client_list_key_size);

        workspace_list->workspaces = calloc(count, sizeof(struct workspace *));

        if (workspace_list->workspaces == NULL) {
                map_destroy(workspace_list->client_map);

                free(workspace_list);

                return NULL;
        }

        return workspace_list;
}